

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O1

void wasm::
     CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
     ::doEndBlock(RelevantLiveLocalsWalker *self,Expression **currp)

{
  _Rb_tree_header *p_Var1;
  Expression *pEVar2;
  CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
  *this;
  _Base_ptr p_Var3;
  char *__to;
  char *extraout_RDX;
  char *__to_00;
  char *extraout_RDX_00;
  _Base_ptr p_Var4;
  Expression *local_38;
  
  pEVar2 = *currp;
  if (pEVar2->_id == BlockId) {
    if (pEVar2[1].type.id != 0) {
      p_Var1 = &(self->
                super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                ).
                super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                .branches._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = *(_Base_ptr *)
                ((long)&(self->
                        super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                        ).
                        super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                        .branches._M_t._M_impl.super__Rb_tree_header._M_header + 8);
      p_Var3 = &p_Var1->_M_header;
      for (; p_Var4 != (_Base_ptr)0x0;
          p_Var4 = (&p_Var4->_M_left)[*(Expression **)(p_Var4 + 1) < pEVar2]) {
        if (*(Expression **)(p_Var4 + 1) >= pEVar2) {
          p_Var3 = p_Var4;
        }
      }
      p_Var4 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
         (p_Var4 = p_Var3, pEVar2 < *(Expression **)(p_Var3 + 1))) {
        p_Var4 = &p_Var1->_M_header;
      }
      if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var4[1]._M_left != p_Var4[1]._M_parent)) {
        this = (CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                *)(self->
                  super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                  ).
                  super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                  .currBasicBlock;
        startBasicBlock((CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                         *)self);
        link(this,(char *)(self->
                          super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                          ).
                          super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                          .currBasicBlock,__to);
        p_Var3 = p_Var4[1]._M_left;
        __to_00 = extraout_RDX;
        for (p_Var4 = p_Var4[1]._M_parent; p_Var4 != p_Var3; p_Var4 = (_Base_ptr)&p_Var4->_M_parent)
        {
          link(*(CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                 **)p_Var4,
               (char *)(self->
                       super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                       ).
                       super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                       .currBasicBlock,__to_00);
          __to_00 = extraout_RDX_00;
        }
        local_38 = pEVar2;
        std::
        map<wasm::Expression_*,_std::vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
        ::erase(&(self->
                 super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                 ).
                 super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                 .branches,&local_38);
      }
    }
    return;
  }
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                ,0x314,"T *wasm::Expression::cast() [T = wasm::Block]");
}

Assistant:

static void doEndBlock(SubType* self, Expression** currp) {
    auto* curr = (*currp)->cast<Block>();
    if (!curr->name.is()) {
      return;
    }
    auto iter = self->branches.find(curr);
    if (iter == self->branches.end()) {
      return;
    }
    auto& origins = iter->second;
    if (origins.size() == 0) {
      return;
    }
    // we have branches to here, so we need a new block
    auto* last = self->currBasicBlock;
    self->startBasicBlock();
    self->link(last, self->currBasicBlock); // fallthrough
    // branches to the new one
    for (auto* origin : origins) {
      self->link(origin, self->currBasicBlock);
    }
    self->branches.erase(curr);
  }